

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cgmres.hpp
# Opt level: O0

void __thiscall Cgmres<Model>::control(Cgmres<Model> *this,double *u,double *x)

{
  double *in_RDX;
  double *in_RSI;
  long in_RDI;
  double U_buf [75];
  double b_vec [75];
  double local_4d8 [2];
  double *in_stack_fffffffffffffb38;
  double *in_stack_fffffffffffffb40;
  double *in_stack_fffffffffffffb48;
  Gmres *in_stack_fffffffffffffb50;
  double local_278 [76];
  double *local_18;
  double *local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  Model::dxdt((double *)in_stack_fffffffffffffb50,in_stack_fffffffffffffb48,
              in_stack_fffffffffffffb40,in_stack_fffffffffffffb38);
  mul(*(double **)(in_RDI + 0x58),*(double **)(in_RDI + 0x58),0.002,4);
  add(*(double **)(in_RDI + 0x58),*(double **)(in_RDI + 0x58),local_18,4);
  F_func((Cgmres<Model> *)U_buf[0x38],(double *)U_buf[0x37],(double *)U_buf[0x36],
         (double *)U_buf[0x35],U_buf[0x34]);
  F_func((Cgmres<Model> *)U_buf[0x38],(double *)U_buf[0x37],(double *)U_buf[0x36],
         (double *)U_buf[0x35],U_buf[0x34]);
  mul(local_278,local_278,-1.0,0x4b);
  sub(local_278,local_278,*(double **)(in_RDI + 0x68),0x4b);
  div((int)local_278,(int)local_278);
  Gmres::gmres(in_stack_fffffffffffffb50,in_stack_fffffffffffffb48,in_stack_fffffffffffffb40);
  mul(local_4d8,*(double **)(in_RDI + 0x50),0.001,0x4b);
  add(*(double **)(in_RDI + 0x48),*(double **)(in_RDI + 0x48),local_4d8,0x4b);
  *(double *)(in_RDI + 0x40) = *(double *)(in_RDI + 0x40) + 0.001;
  mov(local_10,*(double **)(in_RDI + 0x48),3);
  return;
}

Assistant:

void control(double* u, const double* x) {
    double b_vec[len];
    double U_buf[len];

    // x + dxdt * h
    Model::dxdt(x_dxh, x, &U[0], &ptau[0]);
    mul(x_dxh, x_dxh, h, dim_x);
    add(x_dxh, x_dxh, x, dim_x);

    // F(U, x + dxdt * h, t + h)
    F_func(F_dxh_h, U, x_dxh, t + h);

    // F(U, x, t)
    F_func(b_vec, U, x, t);

    // (F(U, x, t) * (1 - zeta * h) - F(U, x + dxdt * h, t + h)) / h
    mul(b_vec, b_vec, (1 - zeta * h), len);
    sub(b_vec, b_vec, F_dxh_h, len);
    div(b_vec, b_vec, h, len);

    // GMRES
    gmres(dUdt, b_vec);

    // U = U + dUdt * dt
    mul(U_buf, dUdt, dt, len);
    add(U, U, U_buf, len);

    // t = t + dt
    // This value may not overflow due to loss of trailing digits
    t = t + dt;

    mov(u, &U[0], dim_u);
  }